

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::ScaleValueFromRatioT<int,int,float>
              (ImGuiDataType data_type,float t,int v_min,int v_max,bool is_logarithmic,
              float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  bool local_51;
  float v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  float v_max_fudged;
  float v_min_fudged;
  bool flipped;
  int result;
  float fStack_24;
  bool is_decimal;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  int iStack_18;
  bool is_logarithmic_local;
  int v_max_local;
  int v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    t_local = 0.0;
  }
  else {
    local_51 = data_type == 8 || data_type == 9;
    flipped = local_51;
    result = (int)zero_deadzone_halfsize;
    fStack_24 = logarithmic_zero_epsilon;
    zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
    logarithmic_zero_epsilon_local = (float)v_max;
    iStack_18 = v_min;
    v_max_local = (int)t;
    v_min_local = data_type;
    if (is_logarithmic) {
      v_min_fudged = (float)v_min;
      if ((0.0 < t) && (v_min_fudged = (float)v_max, t < 1.0)) {
        v_max_fudged._3_1_ = v_max < v_min;
        fVar2 = ImAbs((float)v_min);
        if (fStack_24 <= fVar2) {
          local_5c = (float)iStack_18;
        }
        else {
          if (0.0 <= (float)iStack_18) {
            local_58 = fStack_24;
          }
          else {
            local_58 = -fStack_24;
          }
          local_5c = local_58;
        }
        t_with_flip = local_5c;
        fVar2 = ImAbs((float)(int)logarithmic_zero_epsilon_local);
        if (fStack_24 <= fVar2) {
          local_64 = (float)(int)logarithmic_zero_epsilon_local;
        }
        else {
          if (0.0 <= (float)(int)logarithmic_zero_epsilon_local) {
            local_60 = fStack_24;
          }
          else {
            local_60 = -fStack_24;
          }
          local_64 = local_60;
        }
        zero_point_center = local_64;
        if ((v_max_fudged._3_1_ & 1) != 0) {
          ImSwap<float>(&t_with_flip,&zero_point_center);
        }
        fVar2 = t_with_flip;
        if ((((float)(int)logarithmic_zero_epsilon_local == 0.0) &&
            (!NAN((float)(int)logarithmic_zero_epsilon_local))) && ((float)iStack_18 < 0.0)) {
          zero_point_center = -fStack_24;
        }
        if ((v_max_fudged._3_1_ & 1) == 0) {
          local_68 = (float)v_max_local;
        }
        else {
          local_68 = 1.0 - (float)v_max_local;
        }
        if (0.0 <= (float)(iStack_18 * (int)logarithmic_zero_epsilon_local)) {
          if (((float)iStack_18 < 0.0) || ((float)(int)logarithmic_zero_epsilon_local < 0.0)) {
            fVar2 = -zero_point_center;
            fVar3 = ImPow(-t_with_flip / -zero_point_center,1.0 - local_68);
            fVar2 = -(fVar2 * fVar3);
          }
          else {
            fVar3 = ImPow(zero_point_center / t_with_flip,local_68);
            fVar2 = fVar2 * fVar3;
          }
          v_min_fudged = (float)(int)fVar2;
        }
        else {
          iVar1 = ImMin<int>(iStack_18,(int)logarithmic_zero_epsilon_local);
          fVar3 = ImAbs((float)(int)logarithmic_zero_epsilon_local - (float)iStack_18);
          fVar2 = fStack_24;
          fVar3 = -(float)iVar1 / fVar3;
          fVar4 = fVar3 + (float)result;
          if ((local_68 < fVar3 - (float)result) || (fVar4 < local_68)) {
            if (fVar3 <= local_68) {
              fVar3 = ImPow(zero_point_center / fStack_24,(local_68 - fVar4) / (1.0 - fVar4));
              fVar2 = fVar2 * fVar3;
            }
            else {
              fVar3 = ImPow(-t_with_flip / fStack_24,1.0 - local_68 / (fVar3 - (float)result));
              fVar2 = -(fVar2 * fVar3);
            }
            v_min_fudged = (float)(int)fVar2;
          }
          else {
            v_min_fudged = 0.0;
          }
        }
      }
    }
    else if (data_type == 8 || data_type == 9) {
      v_min_fudged = (float)ImLerp<int>(v_min,v_max,t);
    }
    else {
      v_min_fudged = (float)v_max;
      if (t < 1.0) {
        fVar2 = -0.5;
        if (v_min <= v_max) {
          fVar2 = 0.5;
        }
        v_min_fudged = (float)(v_min + (int)((float)(v_max - v_min) * t + fVar2));
      }
    }
    t_local = v_min_fudged;
  }
  return (int)t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return (TYPE)0.0f;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}